

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void IR::Opnd::GetAddrDescription
               (char16 *description,size_t count,void *address,AddrOpndKind addressKind,
               bool AsmDumpMode,bool printToConsole,Func *func,bool skipMaskedAddress)

{
  code *pcVar1;
  void *pvVar2;
  FrameDisplay *this;
  CodeGenWorkItemType CVar3;
  bool bVar4;
  uint16 uVar5;
  uint uVar6;
  BOOL BVar7;
  uint32 uVar8;
  TypeId TVar9;
  int iVar10;
  RecyclableObject *this_00;
  JavascriptBoolean *this_01;
  JavascriptString *pJVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar12;
  FunctionBody *this_02;
  FunctionInfo *pFVar13;
  LPCSTR pCVar14;
  JavascriptFunction *pJVar15;
  size_t sVar16;
  ThreadContextInfo *pTVar17;
  void *pvVar18;
  ScriptContextInfo *pSVar19;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  JITTimeWorkItem *pJVar20;
  void *pvVar21;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ThreadContext *this_03;
  PreReservedVirtualAllocWrapper *this_04;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char16_t *pcVar22;
  FrameDisplay *frameDisplay;
  TypeId typeId;
  RecyclableObject *dynamicObject;
  char16 *addressName;
  char16 *format_2;
  char16 *format_1;
  char16 *format;
  size_t n;
  char16 *buffer;
  bool skipMaskedAddress_local;
  bool printToConsole_local;
  bool AsmDumpMode_local;
  FunctionProxy *pFStack_20;
  AddrOpndKind addressKind_local;
  void *address_local;
  size_t count_local;
  char16 *description_local;
  
  buffer._4_1_ = skipMaskedAddress;
  format = (char16 *)count;
  n = (size_t)description;
  buffer._5_1_ = printToConsole;
  buffer._6_1_ = AsmDumpMode;
  buffer._7_1_ = addressKind;
  pFStack_20 = (FunctionProxy *)address;
  address_local = (void *)count;
  count_local = (size_t)description;
  if (address == (void *)0x0) {
    WriteToBuffer((char16 **)&n,(size_t *)&format,L"(NULL)");
  }
  else {
    switch(addressKind) {
    case AddrOpndKindConstantAddress:
      WriteToBuffer((char16 **)&n,(size_t *)&format,L"0x%012I64X",address);
      break;
    case AddrOpndKindConstantVar:
      dynamicObject = (RecyclableObject *)0x180ca08;
      if ((undefined1 *)address == &DAT_40002fff80002) {
        dynamicObject = (RecyclableObject *)anon_var_dwarf_1382819;
      }
      else if ((undefined1 *)address == &DAT_fffc000000000000) {
        dynamicObject = (RecyclableObject *)anon_var_dwarf_1382836;
      }
      WriteToBuffer((char16 **)&n,(size_t *)&format,L"0x%012I64X%s",address,dynamicObject);
      break;
    case AddrOpndKindDynamicScriptContext:
      if (func != (Func *)0x0) {
        pSVar19 = Func::GetScriptContextInfo(func);
        iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x20])();
        if (address != (void *)CONCAT44(extraout_var_00,iVar10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                             ,0xe64,
                             "(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr())"
                             ,
                             "func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr()"
                            );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
      }
      DumpAddress(pFStack_20,(bool)(buffer._5_1_ & 1),(bool)(buffer._4_1_ & 1));
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (ScriptContext)");
      break;
    case AddrOpndKindDynamicVtable:
      if ((undefined1 *)address == &DAT_00000001) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L"%d (Invalid Vtable)",1);
      }
      else {
        DumpAddress(address,printToConsole,skipMaskedAddress);
        pCVar14 = Func::GetVtableName(func,(INT_PTR)pFStack_20);
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (%S Vtable)",pCVar14);
      }
      break;
    case AddrOpndKindDynamicCharStringCache:
      if (func != (Func *)0x0) {
        pSVar19 = Func::GetScriptContextInfo(func);
        iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x11])();
        if (address != (void *)CONCAT44(extraout_var_01,iVar10)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                             ,0xe6a,
                             "(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr())"
                             ,
                             "func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr()"
                            );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
      }
      DumpAddress(pFStack_20,(bool)(buffer._5_1_ & 1),(bool)(buffer._4_1_ & 1));
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (CharStringCache)");
      break;
    default:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      pvVar2 = pFStack_20;
      pTVar17 = Func::GetThreadContextInfo(func);
      pvVar18 = (void *)ThreadContextInfo::GetNullFrameDisplayAddr(pTVar17);
      pvVar21 = pFStack_20;
      if (pvVar2 == pvVar18) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (NullFrameDisplay)");
      }
      else {
        pTVar17 = Func::GetThreadContextInfo(func);
        pvVar18 = (void *)ThreadContextInfo::GetStrictNullFrameDisplayAddr(pTVar17);
        pvVar2 = pFStack_20;
        if (pvVar21 == pvVar18) {
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (StrictNullFrameDisplay)");
        }
        else {
          pSVar19 = Func::GetScriptContextInfo(func);
          iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x1b])();
          pvVar21 = pFStack_20;
          if (pvVar2 == (void *)CONCAT44(extraout_var_02,iVar10)) {
            WriteToBuffer((char16 **)&n,(size_t *)&format,L" (NumberAllocator)");
          }
          else {
            pSVar19 = Func::GetScriptContextInfo(func);
            iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x1c])();
            if (pvVar21 == (void *)CONCAT44(extraout_var_03,iVar10)) {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Recycler)");
            }
            else {
              pJVar20 = Func::GetWorkItem(func);
              CVar3 = JITTimeWorkItem::Type(pJVar20);
              pvVar2 = pFStack_20;
              if (CVar3 == JsFunctionType) {
                pJVar20 = Func::GetWorkItem(func);
                pvVar21 = (void *)JITTimeWorkItem::GetCallsCountAddress(pJVar20);
                if (pvVar2 == pvVar21) {
                  WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&CallCount)");
                  return;
                }
              }
              pvVar2 = pFStack_20;
              pTVar17 = Func::GetThreadContextInfo(func);
              iVar10 = (*pTVar17->_vptr_ThreadContextInfo[5])();
              pvVar21 = pFStack_20;
              if (pvVar2 == (void *)CONCAT44(extraout_var_04,iVar10)) {
                WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&ImplicitCallFlags)");
              }
              else {
                pTVar17 = Func::GetThreadContextInfo(func);
                iVar10 = (*pTVar17->_vptr_ThreadContextInfo[4])();
                pvVar2 = pFStack_20;
                if (pvVar21 == (void *)CONCAT44(extraout_var_05,iVar10)) {
                  WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&DisableImplicitCallFlags)");
                }
                else {
                  pTVar17 = Func::GetThreadContextInfo(func);
                  iVar10 = (*pTVar17->_vptr_ThreadContextInfo[3])();
                  if (pvVar2 == (void *)CONCAT44(extraout_var_06,iVar10)) {
                    WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&StackLimit)");
                  }
                  else {
                    bVar4 = Func::CanAllocInPreReservedHeapPageSegment(func);
                    if (bVar4) {
                      this_03 = Func::GetInProcThreadContext(func);
                      this_04 = ThreadContext::GetPreReservedVirtualAllocator(this_03);
                      bVar4 = Memory::PreReservedVirtualAllocWrapper::IsPreReservedEndAddress
                                        (this_04,pFStack_20);
                      if (bVar4) {
                        WriteToBuffer((char16 **)&n,(size_t *)&format,
                                      L" (PreReservedCodeSegmentEnd)");
                        return;
                      }
                    }
                    pvVar2 = pFStack_20;
                    pSVar19 = Func::GetScriptContextInfo(func);
                    iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x12])();
                    pvVar21 = pFStack_20;
                    if (pvVar2 == (void *)CONCAT44(extraout_var_07,iVar10)) {
                      WriteToBuffer((char16 **)&n,(size_t *)&format,
                                    L" (&OptimizationOverrides_SideEffects)");
                    }
                    else {
                      pSVar19 = Func::GetScriptContextInfo(func);
                      iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x13])();
                      pvVar2 = pFStack_20;
                      if (pvVar21 == (void *)CONCAT44(extraout_var_08,iVar10)) {
                        WriteToBuffer((char16 **)&n,(size_t *)&format,
                                      L" (&OptimizationOverrides_ArraySetElementFastPathVtable)");
                      }
                      else {
                        pSVar19 = Func::GetScriptContextInfo(func);
                        iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x14])();
                        pvVar21 = pFStack_20;
                        if (pvVar2 == (void *)CONCAT44(extraout_var_09,iVar10)) {
                          WriteToBuffer((char16 **)&n,(size_t *)&format,
                                        L" (&OptimizationOverrides_IntArraySetElementFastPathVtable)"
                                       );
                        }
                        else {
                          pSVar19 = Func::GetScriptContextInfo(func);
                          iVar10 = (*pSVar19->_vptr_ScriptContextInfo[0x15])();
                          if (pvVar21 == (void *)CONCAT44(extraout_var_10,iVar10)) {
                            WriteToBuffer((char16 **)&n,(size_t *)&format,
                                          L" (&OptimizationOverrides_FloatArraySetElementFastPathVtable)"
                                         );
                          }
                          else {
                            WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Unknown)");
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    case AddrOpndKindDynamicFunctionBody:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      bVar4 = Func::IsOOPJIT(func);
      if (bVar4) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (FunctionBody)");
      }
      else {
        pFVar13 = Js::FunctionProxy::GetFunctionInfo(pFStack_20);
        DumpFunctionInfo((char16 **)&n,(size_t *)&format,pFVar13,(bool)(buffer._5_1_ & 1),
                         (char16 *)0x0);
      }
      break;
    case AddrOpndKindDynamicFunctionInfo:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      bVar4 = Func::IsOOPJIT(func);
      if (bVar4) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (FunctionInfo)");
      }
      else {
        DumpFunctionInfo((char16 **)&n,(size_t *)&format,(FunctionInfo *)pFStack_20,
                         (bool)(buffer._5_1_ & 1),(char16 *)0x0);
      }
      break;
    case AddrOpndKindDynamicInlineCache:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (InlineCache)");
      break;
    case AddrOpndKindDynamicBailOutRecord:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (BailOutRecord)");
      break;
    case AddrOpndKindDynamicVar:
      bVar4 = Js::TaggedInt::Is(address);
      pJVar15 = (JavascriptFunction *)pFStack_20;
      if (bVar4) {
        uVar6 = Js::TaggedInt::ToInt32(pFStack_20);
        WriteToBuffer((char16 **)&n,(size_t *)&format,L"0x%012I64X (value: %d)",pJVar15,(ulong)uVar6
                     );
      }
      else {
        bVar4 = Js::JavascriptNumber::Is_NoTaggedIntCheck(pFStack_20);
        if (bVar4) {
          Js::JavascriptNumber::GetValue(pFStack_20);
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (value: %f)");
        }
        else {
          DumpAddress(pFStack_20,(bool)(buffer._5_1_ & 1),(bool)(buffer._4_1_ & 1));
          bVar4 = Func::IsOOPJIT(func);
          if (bVar4) {
            WriteToBuffer((char16 **)&n,(size_t *)&format,L" (unknown)");
          }
          else {
            this_00 = Js::VarTo<Js::RecyclableObject>(pFStack_20);
            TVar9 = Js::RecyclableObject::GetTypeId(this_00);
            if (TVar9 == TypeIds_Undefined) {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (undefined)");
            }
            else if (TVar9 == TypeIds_Null) {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (null)");
            }
            else if (TVar9 == TypeIds_Boolean) {
              this_01 = Js::VarTo<Js::JavascriptBoolean>(pFStack_20);
              BVar7 = Js::JavascriptBoolean::GetValue(this_01);
              pcVar22 = L" (false)";
              if (BVar7 != 0) {
                pcVar22 = L" (true)";
              }
              WriteToBuffer((char16 **)&n,(size_t *)&format,pcVar22);
            }
            else if (TVar9 == TypeIds_Number) {
              Js::JavascriptNumber::GetValue(pFStack_20);
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (value: %f)");
            }
            else if (TVar9 == TypeIds_String) {
              pJVar11 = Js::VarTo<Js::JavascriptString>(pFStack_20);
              iVar10 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.
                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (\"%s\")",
                            CONCAT44(extraout_var,iVar10));
            }
            else if (TVar9 == TypeIds_LastStaticType) {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (UndeclBlockVar)");
            }
            else if (TVar9 == TypeIds_Function) {
              pFVar13 = Js::JavascriptFunction::GetFunctionInfo((JavascriptFunction *)pFStack_20);
              DumpFunctionInfo((char16 **)&n,(size_t *)&format,pFVar13,(bool)(buffer._5_1_ & 1),
                               L"FunctionObject");
            }
            else if (TVar9 == TypeIds_GlobalObject) {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (GlobalObject)");
            }
            else {
              WriteToBuffer((char16 **)&n,(size_t *)&format,L" (DynamicObject)");
            }
          }
        }
      }
      break;
    case AddrOpndKindDynamicType:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      bVar4 = Func::IsOOPJIT(func);
      if (!bVar4) {
        TVar9 = Js::Type::GetTypeId((Type *)pFStack_20);
        switch(TVar9) {
        case TypeIds_Number:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: StaticNumber)");
          break;
        default:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: Id %d)",(ulong)TVar9);
          break;
        case TypeIds_String:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: StaticString)");
          break;
        case TypeIds_Object:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: Object)");
          break;
        case TypeIds_Array:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: Array)");
          break;
        case TypeIds_NativeIntArray:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: NativeIntArray)");
          break;
        case TypeIds_ArrayLast:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: NativeFltArray)");
          break;
        case TypeIds_RegEx:
          WriteToBuffer((char16 **)&n,(size_t *)&format,L" (Type: Regex)");
        }
      }
      break;
    case AddrOpndKindDynamicTypeHandler:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (TypeHandler)");
      break;
    case AddrOpndKindDynamicFrameDisplay:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      bVar4 = Func::IsOOPJIT(func);
      this = (FrameDisplay *)pFStack_20;
      if (bVar4) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (FrameDisplay)");
      }
      else {
        bVar4 = Js::FrameDisplay::GetStrictMode((FrameDisplay *)pFStack_20);
        pcVar22 = L" (FrameDisplay len %d)";
        if (bVar4) {
          pcVar22 = L" (StrictFrameDisplay len %d)";
        }
        uVar5 = Js::FrameDisplay::GetLength(this);
        WriteToBuffer((char16 **)&n,(size_t *)&format,pcVar22,(ulong)uVar5);
      }
      break;
    case AddrOpndKindDynamicGuardValueRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&GuardValue)");
      break;
    case AddrOpndKindDynamicArrayCallSiteInfo:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (ArrayCallSiteInfo)");
      break;
    case AddrOpndKindDynamicFunctionBodyWeakRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      bVar4 = Func::IsOOPJIT(func);
      if (bVar4) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (FunctionBodyWeakRef)");
      }
      else {
        this_02 = Memory::RecyclerWeakReference<Js::FunctionBody>::FastGet
                            ((RecyclerWeakReference<Js::FunctionBody> *)pFStack_20);
        pFVar13 = Js::FunctionProxy::GetFunctionInfo((FunctionProxy *)this_02);
        DumpFunctionInfo((char16 **)&n,(size_t *)&format,pFVar13,(bool)(buffer._5_1_ & 1),
                         L"FunctionBodyWeakRef");
      }
      break;
    case AddrOpndKindDynamicObjectTypeRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      pvVar2 = pFStack_20;
      uVar8 = Js::RecyclableObject::GetOffsetOfType();
      bVar4 = Func::IsOOPJIT(func);
      if ((bVar4) ||
         (bVar4 = Js::VarIs<Js::JavascriptFunction,Js::RecyclableObject>
                            ((RecyclableObject *)((long)pvVar2 - (ulong)uVar8)), pvVar2 = pFStack_20
         , !bVar4)) {
        WriteToBuffer((char16 **)&n,(size_t *)&format,L" (ObjectTypeRef)");
      }
      else {
        uVar8 = Js::RecyclableObject::GetOffsetOfType();
        pJVar15 = Js::VarTo<Js::JavascriptFunction>((Var)((long)pvVar2 - (ulong)uVar8));
        pFVar13 = Js::JavascriptFunction::GetFunctionInfo(pJVar15);
        DumpFunctionInfo((char16 **)&n,(size_t *)&format,pFVar13,(bool)(buffer._5_1_ & 1),
                         L"FunctionObjectTypeRef");
      }
      break;
    case AddrOpndKindDynamicTypeCheckGuard:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (TypeCheckGuard)");
      break;
    case AddrOpndKindDynamicRecyclerAllocatorEndAddressRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&RecyclerAllocatorEndAddress)");
      break;
    case AddrOpndKindDynamicRecyclerAllocatorFreeListRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&RecyclerAllocatorFreeList)");
      break;
    case AddrOpndKindDynamicBailOutKindRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&BailOutKind)");
      break;
    case AddrOpndKindDynamicAuxSlotArrayRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&AuxSlotArray)");
      break;
    case AddrOpndKindDynamicPropertySlotRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&PropertySlot)");
      break;
    case AddrOpndKindDynamicFunctionEnvironmentRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      pvVar2 = pFStack_20;
      uVar8 = Js::ScriptFunction::GetOffsetOfEnvironment();
      pFVar13 = Js::JavascriptFunction::GetFunctionInfo
                          ((JavascriptFunction *)((long)pvVar2 - (ulong)uVar8));
      DumpFunctionInfo((char16 **)&n,(size_t *)&format,pFVar13,(bool)(buffer._5_1_ & 1),
                       L"ScriptFunctionEnvironmentRef");
      break;
    case AddrOpndKindDynamicIsInstInlineCacheFunctionRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&IsInstInlineCache.function)");
      break;
    case AddrOpndKindDynamicIsInstInlineCacheTypeRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&IsInstInlineCache.type)");
      break;
    case AddrOpndKindDynamicIsInstInlineCacheResultRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&IsInstInlineCache.result)");
      break;
    case AddrOpndKindSz:
      sVar16 = PAL_wcslen((char16_t *)address);
      pcVar22 = L"\"%.30s\"";
      if (0x1e < sVar16) {
        pcVar22 = L"\"%.30s...\"";
      }
      WriteToBuffer((char16 **)&n,(size_t *)&format,pcVar22,pFStack_20);
      break;
    case AddrOpndKindDynamicFloatRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&(float)%f)",(double)*(float *)pFStack_20);
      break;
    case AddrOpndKindDynamicDoubleRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&(double)%f)",
                    pFStack_20->super_FinalizableObject);
      break;
    case AddrOpndKindDynamicNativeCodeDataRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&NativeCodeData)");
      break;
    case AddrOpndKindDynamicAuxBufferRef:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (AuxBufferRef)");
      break;
    case AddrOpndKindForInCache:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (EnumeratorCache)");
      break;
    case AddrOpndKindForInCacheType:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&EnumeratorCache->type)");
      break;
    case AddrOpndKindForInCacheData:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&EnumeratorCache->data)");
      break;
    case AddrOpndKindWriteBarrierCardTable:
      DumpAddress(address,printToConsole,skipMaskedAddress);
      WriteToBuffer((char16 **)&n,(size_t *)&format,L" (&WriteBarrierCardTable)");
    }
  }
  return;
}

Assistant:

void
Opnd::GetAddrDescription(__out_ecount(count) char16 *const description, const size_t count,
    void * address, IR::AddrOpndKind addressKind, bool AsmDumpMode, bool printToConsole, Func *func, bool skipMaskedAddress)
{
    char16 *buffer = description;
    size_t n = count;

    if (address)
    {
        switch (addressKind)
        {
        case IR::AddrOpndKindConstantAddress:
        {
#ifdef TARGET_64
            char16 const * format = _u("0x%012I64X");
#else
            char16 const * format = _u("0x%08X");
#endif
            WriteToBuffer(&buffer, &n, format, address);
        }
        break;
        case IR::AddrOpndKindDynamicVar:
            if (Js::TaggedInt::Is(address))
            {
#ifdef TARGET_64
                char16 const * format = _u("0x%012I64X (value: %d)");
#else
                char16 const * format = _u("0x%08X  (value: %d)");
#endif
                WriteToBuffer(&buffer, &n, format, address, Js::TaggedInt::ToInt32(address));
            }
#if FLOATVAR
            else if (Js::JavascriptNumber::Is_NoTaggedIntCheck(address))
#else
            else if (!func->IsOOPJIT() && Js::JavascriptNumber::Is_NoTaggedIntCheck(address))
#endif
            {
                WriteToBuffer(&buffer, &n, _u(" (value: %f)"), Js::JavascriptNumber::GetValue(address));
            }
            else
            {
                DumpAddress(address, printToConsole, skipMaskedAddress);
                // TODO: michhol OOP JIT, fix dumping these
                if (func->IsOOPJIT())
                {
                    WriteToBuffer(&buffer, &n, _u(" (unknown)"));
                }
                else
                {
                    switch (Js::VarTo<Js::RecyclableObject>(address)->GetTypeId())
                    {
                    case Js::TypeIds_Boolean:
                        WriteToBuffer(&buffer, &n, Js::VarTo<Js::JavascriptBoolean>(address)->GetValue() ? _u(" (true)") : _u(" (false)"));
                        break;
                    case Js::TypeIds_String:
                        WriteToBuffer(&buffer, &n, _u(" (\"%s\")"), Js::VarTo<Js::JavascriptString>(address)->GetSz());
                        break;
                    case Js::TypeIds_Number:
                        WriteToBuffer(&buffer, &n, _u(" (value: %f)"), Js::JavascriptNumber::GetValue(address));
                        break;
                    case Js::TypeIds_Undefined:
                        WriteToBuffer(&buffer, &n, _u(" (undefined)"));
                        break;
                    case Js::TypeIds_Null:
                        WriteToBuffer(&buffer, &n, _u(" (null)"));
                        break;
                    case Js::TypeIds_GlobalObject:
                        WriteToBuffer(&buffer, &n, _u(" (GlobalObject)"));
                        break;
                    case Js::TypeIds_UndeclBlockVar:
                        WriteToBuffer(&buffer, &n, _u(" (UndeclBlockVar)"));
                        break;
                    case Js::TypeIds_Function:
                        DumpFunctionInfo(&buffer, &n, ((Js::JavascriptFunction *)address)->GetFunctionInfo(), printToConsole, _u("FunctionObject"));
                        break;
                    default:
                        WriteToBuffer(&buffer, &n, _u(" (DynamicObject)"));
                        break;
                    }
                }
            }
            break;
        case IR::AddrOpndKindConstantVar:
        {
#ifdef TARGET_64
            char16 const * format = _u("0x%012I64X%s");
#else
            char16 const * format = _u("0x%08X%s");
#endif
            char16 const * addressName = _u("");

            if (address == Js::JavascriptArray::MissingItem)
            {
                addressName = _u(" (MissingItem)");
            }
#if FLOATVAR
            else if (address == (Js::Var)Js::FloatTag_Value)
            {
                addressName = _u(" (FloatTag)");
            }
#endif
            WriteToBuffer(&buffer, &n, format, address, addressName);
            break;
        }
        case IR::AddrOpndKindDynamicScriptContext:
            Assert(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetAddr());
            // The script context pointer is unstable allocated from the CRT
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (ScriptContext)"));
            break;
        case IR::AddrOpndKindDynamicCharStringCache:
            Assert(func == nullptr || (intptr_t)address == func->GetScriptContextInfo()->GetCharStringCacheAddr());
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (CharStringCache)"));
            break;

        case IR::AddrOpndKindDynamicBailOutRecord:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (BailOutRecord)"));
            break;

        case IR::AddrOpndKindDynamicInlineCache:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (InlineCache)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheFunctionRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.function)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheTypeRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.type)"));
            break;

        case IR::AddrOpndKindDynamicIsInstInlineCacheResultRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&IsInstInlineCache.result)"));
            break;

        case AddrOpndKindDynamicGuardValueRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&GuardValue)"));
            break;

        case AddrOpndKindDynamicAuxSlotArrayRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&AuxSlotArray)"));
            break;

        case AddrOpndKindDynamicPropertySlotRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&PropertySlot)"));
            break;

        case AddrOpndKindDynamicBailOutKindRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&BailOutKind)"));
            break;

        case AddrOpndKindDynamicArrayCallSiteInfo:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (ArrayCallSiteInfo)"));
            break;

        case AddrOpndKindDynamicTypeCheckGuard:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (TypeCheckGuard)"));
            break;

        case AddrOpndKindDynamicRecyclerAllocatorEndAddressRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&RecyclerAllocatorEndAddress)"));
            break;

        case AddrOpndKindDynamicAuxBufferRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (AuxBufferRef)"));
            break;

        case AddrOpndKindDynamicRecyclerAllocatorFreeListRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&RecyclerAllocatorFreeList)"));
            break;

        case IR::AddrOpndKindDynamicFunctionInfo:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionInfo)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, (Js::FunctionInfo *)address, printToConsole);
            }
            break;

        case IR::AddrOpndKindDynamicFunctionBody:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionBody)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, ((Js::FunctionBody *)address)->GetFunctionInfo(), printToConsole);
            }
            break;

        case IR::AddrOpndKindDynamicFunctionBodyWeakRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);

            if (func->IsOOPJIT())
            {
                // TODO: OOP JIT, dump more info
                WriteToBuffer(&buffer, &n, _u(" (FunctionBodyWeakRef)"));
            }
            else
            {
                DumpFunctionInfo(&buffer, &n, ((RecyclerWeakReference<Js::FunctionBody> *)address)->FastGet()->GetFunctionInfo(), printToConsole, _u("FunctionBodyWeakRef"));
            }
            break;

        case IR::AddrOpndKindDynamicFunctionEnvironmentRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            DumpFunctionInfo(&buffer, &n, ((Js::ScriptFunction *)((intptr_t)address - Js::ScriptFunction::GetOffsetOfEnvironment()))->GetFunctionInfo(),
                printToConsole, _u("ScriptFunctionEnvironmentRef"));
            break;
        case IR::AddrOpndKindDynamicVtable:
            if ((INT_PTR)address == Js::ScriptContextOptimizationOverrideInfo::InvalidVtable)
            {
                WriteToBuffer(&buffer, &n, _u("%d (Invalid Vtable)"), Js::ScriptContextOptimizationOverrideInfo::InvalidVtable);
            }
            else
            {
                DumpAddress(address, printToConsole, skipMaskedAddress);
                WriteToBuffer(&buffer, &n, _u(" (%S Vtable)"), func->GetVtableName((INT_PTR)address));
            }
            break;

        case IR::AddrOpndKindDynamicTypeHandler:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (TypeHandler)"));
            break;

        case IR::AddrOpndKindDynamicObjectTypeRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            {
                Js::RecyclableObject * dynamicObject = (Js::RecyclableObject *)((intptr_t)address - Js::RecyclableObject::GetOffsetOfType());
                if (!func->IsOOPJIT() && Js::VarIs<Js::JavascriptFunction>(dynamicObject))
                {
                    DumpFunctionInfo(&buffer, &n, Js::VarTo<Js::JavascriptFunction>((void *)((intptr_t)address - Js::RecyclableObject::GetOffsetOfType()))->GetFunctionInfo(),
                        printToConsole, _u("FunctionObjectTypeRef"));
                }
                else
                {
                    // TODO: OOP JIT, dump more info
                    WriteToBuffer(&buffer, &n, _u(" (ObjectTypeRef)"));
                }
            }
            break;

        case IR::AddrOpndKindDynamicType:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            // TODO: OOP JIT, dump more info
            if(!func->IsOOPJIT())
            {
                Js::TypeId typeId = ((Js::Type*)address)->GetTypeId();
                switch (typeId)
                {
                case Js::TypeIds_Number:
                    WriteToBuffer(&buffer, &n, _u(" (Type: StaticNumber)"));
                    break;
                case Js::TypeIds_String:
                    WriteToBuffer(&buffer, &n, _u(" (Type: StaticString)"));
                    break;
                case Js::TypeIds_Object:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Object)"));
                    break;
                case Js::TypeIds_RegEx:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Regex)"));
                    break;
                case Js::TypeIds_Array:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Array)"));
                    break;
                case Js::TypeIds_NativeIntArray:
                    WriteToBuffer(&buffer, &n, _u(" (Type: NativeIntArray)"));
                    break;
                case Js::TypeIds_NativeFloatArray:
                    WriteToBuffer(&buffer, &n, _u(" (Type: NativeFltArray)"));
                    break;
                default:
                    WriteToBuffer(&buffer, &n, _u(" (Type: Id %d)"), typeId);
                    break;
                }
            }
            break;

        case AddrOpndKindDynamicFrameDisplay:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if (!func->IsOOPJIT())
            {
                Js::FrameDisplay * frameDisplay = (Js::FrameDisplay *)address;
                WriteToBuffer(&buffer, &n, (frameDisplay->GetStrictMode() ? _u(" (StrictFrameDisplay len %d)") : _u(" (FrameDisplay len %d)")),
                    frameDisplay->GetLength());
            }
            else
            {
                WriteToBuffer(&buffer, &n, _u(" (FrameDisplay)"));
            }
            break;
        case AddrOpndKindSz:
            WriteToBuffer(&buffer, &n, wcslen((char16 const *)address) > 30 ? _u("\"%.30s...\"") : _u("\"%.30s\""), address);
            break;
        case AddrOpndKindDynamicFloatRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&(float)%f)"), *(float *)address);
            break;
        case AddrOpndKindDynamicDoubleRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&(double)%f)"), *(double *)address);
            break;
        case AddrOpndKindForInCache:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (EnumeratorCache)"));
            break;
        case AddrOpndKindForInCacheType:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&EnumeratorCache->type)"));
            break;
        case AddrOpndKindForInCacheData:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&EnumeratorCache->data)"));
            break;
        case AddrOpndKindDynamicNativeCodeDataRef:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&NativeCodeData)"));
            break;
        case AddrOpndKindWriteBarrierCardTable:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            WriteToBuffer(&buffer, &n, _u(" (&WriteBarrierCardTable)"));
            break;
        default:
            DumpAddress(address, printToConsole, skipMaskedAddress);
            if ((intptr_t)address == func->GetThreadContextInfo()->GetNullFrameDisplayAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (NullFrameDisplay)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetStrictNullFrameDisplayAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (StrictNullFrameDisplay)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetNumberAllocatorAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (NumberAllocator)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetRecyclerAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (Recycler)"));
            }
            else if (func->GetWorkItem()->Type() == JsFunctionType && (intptr_t)address == func->GetWorkItem()->GetCallsCountAddress())
            {
                WriteToBuffer(&buffer, &n, _u(" (&CallCount)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetImplicitCallFlagsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&ImplicitCallFlags)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&DisableImplicitCallFlags)"));
            }
            else if ((intptr_t)address == func->GetThreadContextInfo()->GetThreadStackLimitAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&StackLimit)"));
            }
            else if (func->CanAllocInPreReservedHeapPageSegment() &&
#if ENABLE_OOP_NATIVE_CODEGEN
                (func->IsOOPJIT()
                    ? func->GetOOPThreadContext()->GetPreReservedSectionAllocator()->IsPreReservedEndAddress(address)
                    : func->GetInProcThreadContext()->GetPreReservedVirtualAllocator()->IsPreReservedEndAddress(address)
                )
#else
                func->GetInProcThreadContext()->GetPreReservedVirtualAllocator()->IsPreReservedEndAddress(address)
#endif
                )
            {
                WriteToBuffer(&buffer, &n, _u(" (PreReservedCodeSegmentEnd)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetSideEffectsAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_SideEffects)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_ArraySetElementFastPathVtable)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_IntArraySetElementFastPathVtable)"));
            }
            else if ((intptr_t)address == func->GetScriptContextInfo()->GetFloatArraySetElementFastPathVtableAddr())
            {
                WriteToBuffer(&buffer, &n, _u(" (&OptimizationOverrides_FloatArraySetElementFastPathVtable)"));
            }
            else
            {
                WriteToBuffer(&buffer, &n, _u(" (Unknown)"));
            }
        }
    }